

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall
aggreports::OutputRows
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,char *buffer,int strLen)

{
  pointer pmVar1;
  bool bVar2;
  uint uVar3;
  code *pcVar4;
  mapped_type *pmVar5;
  int epcalc;
  aggreports *paVar6;
  pointer piVar7;
  ulong *extraout_RDX;
  int unaff_EBX;
  aggreports *paVar8;
  uint uVar9;
  ulong unaff_RBP;
  char *pcVar10;
  aggreports *paVar11;
  float *in_R8;
  int in_R9D;
  map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  *unaff_R12;
  int *piVar12;
  code *unaff_R13;
  ulong uVar13;
  long unaff_R14;
  ulong uVar14;
  aggreports *unaff_R15;
  double extraout_XMM0_Qa;
  double dVar15;
  undefined8 in_XMM1_Qa;
  double in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  float fStack_d0;
  int iStack_cc;
  double dStack_c8;
  float fStack_c0;
  float fStack_bc;
  double dStack_b8;
  aggreports *paStack_b0;
  float *pfStack_a8;
  long *plStack_a0;
  double dStack_98;
  char *pcStack_90;
  double dStack_88;
  double dStack_80;
  aggreports *paStack_78;
  int *piStack_70;
  ulong uStack_68;
  ulong uStack_60;
  aggreports *paStack_58;
  ulong uStack_50;
  aggreports *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  piVar12 = (fileIDs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  if (piVar12 !=
      (fileIDs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar14 = (ulong)(uint)strLen;
    local_40 = (aggreports *)buffer;
    local_38 = fileIDs;
    do {
      uVar13 = 1;
      paVar8 = local_40;
LAB_0010b2d6:
      paVar6 = (aggreports *)(long)*piVar12;
      pcVar10 = "%s";
      uStack_50 = 0x10b2f3;
      uVar3 = fprintf((FILE *)this->fout_[(long)paVar6],"%s",paVar8);
      fStack_c0 = (float)in_XMM1_Qa;
      fStack_bc = (float)in_XMM3_Qa;
      if ((int)uVar3 < 0) {
        uStack_50 = 0x10b359;
        OutputRows(local_40);
        goto LAB_0010b359;
      }
      uVar9 = (int)uVar14 - uVar3;
      unaff_RBP = (ulong)uVar9;
      if (uVar9 != 0 && (int)uVar3 <= (int)uVar14) goto code_r0x0010b2fe;
      piVar12 = piVar12 + 1;
    } while (piVar12 !=
             (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
code_r0x0010b2fe:
  paVar8 = (aggreports *)((long)&paVar8->totalperiods_ + (ulong)uVar3);
  pcVar10 = "INFO: Attempt %d to write %s\n";
  uStack_50 = 0x10b323;
  paVar6 = local_40;
  fprintf(_stderr,"INFO: Attempt %d to write %s\n",uVar13);
  fStack_c0 = (float)in_XMM1_Qa;
  fStack_bc = (float)in_XMM3_Qa;
  uVar3 = (int)uVar13 + 1;
  uVar13 = (ulong)uVar3;
  uVar14 = (ulong)uVar9;
  if (uVar3 == 0xb) {
LAB_0010b359:
    uStack_50 = 0x10b363;
    paVar11 = local_40;
    OutputRows(local_40);
    bVar2 = fStack_c0 != 0.0;
    dStack_98 = (double)fStack_c0;
    plStack_a0 = (long *)((long)&paVar11->totalperiods_ + unaff_R14);
    dVar15 = extraout_XMM0_Qa;
    iStack_cc = in_R9D;
    dStack_b8 = extraout_XMM0_Qa;
    paStack_b0 = paVar6;
    pfStack_a8 = in_R8;
    pcStack_90 = pcVar10;
    dStack_80 = in_XMM2_Qa;
    paStack_78 = paVar8;
    piStack_70 = piVar12;
    uStack_68 = uVar13;
    uStack_60 = uVar14;
    paStack_58 = this;
    uStack_50 = unaff_RBP;
    goto LAB_0010b3f5;
  }
  goto LAB_0010b2d6;
  while( true ) {
    if (dStack_c8 <= dStack_80) {
      fStack_d0 = 0.0;
      if (bVar2 && extraout_XMM0_Qa != 0.0) {
        fStack_d0 = fStack_c0;
        if (((dStack_c8 != dVar15) || (NAN(dStack_c8) || NAN(dVar15))) &&
           (fStack_d0 = -1.0, dVar15 < dStack_c8)) {
          fStack_d0 = (float)((((double)*pfStack_a8 - dStack_98) * (dStack_c8 - dVar15)) /
                              (*(double *)paStack_b0 - dVar15) + dStack_98);
        }
      }
      if (unaff_R13 != (code *)0x0) {
        pcVar4 = unaff_R13;
        if (((ulong)unaff_R13 & 1) != 0) {
          pcVar4 = *(code **)(unaff_R13 + *plStack_a0 + -1);
        }
        piVar7 = (pointer)((ulong)local_38 & 0xffffffff);
        (*pcVar4)(dStack_c8,plStack_a0,pcStack_90,iStack_cc,piVar7,(ulong)local_40 & 0xffffffff);
        dVar15 = dStack_b8;
      }
      epcalc = (int)piVar7;
      paVar8 = unaff_R15;
      if (unaff_R15 != (aggreports *)0x0) {
        pmVar5 = std::
                 map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                 ::operator[]((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                               *)unaff_R15,&iStack_cc);
        (pmVar5->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
        super__Vector_impl_data._M_start[*extraout_RDX].retperiod = dStack_c8;
        dStack_88 = (double)fStack_d0;
        pmVar5 = std::
                 map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                 ::operator[]((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                               *)unaff_R15,&iStack_cc);
        pmVar1 = (pmVar5->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pmVar1[*extraout_RDX].mean = dStack_88 + pmVar1[*extraout_RDX].mean;
        pmVar5 = std::
                 map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                 ::operator[]((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                               *)unaff_R15,&iStack_cc);
        epcalc = (int)*extraout_RDX * 3;
        piVar12 = &(pmVar5->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
                   super__Vector_impl_data._M_start[*extraout_RDX].count;
        *piVar12 = *piVar12 + 1;
        dVar15 = dStack_b8;
      }
      if ((dVar15 != 0.0) || (NAN(dVar15))) {
        fStack_bc = fStack_bc - (fStack_bc - fStack_d0) / (float)unaff_EBX;
        FillTVaR(paVar8,unaff_R12,iStack_cc,epcalc,dStack_c8,fStack_bc);
        dVar15 = dStack_b8;
      }
      *extraout_RDX = *extraout_RDX + 1;
      unaff_EBX = unaff_EBX + 1;
    }
    else {
      *extraout_RDX = uVar14 + 1;
    }
    if (dStack_c8 < dVar15) break;
LAB_0010b3f5:
    uVar14 = *extraout_RDX;
    piVar7 = (paVar11->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(paVar11->returnperiods_).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar7 >> 2) <= uVar14) {
      return;
    }
    dStack_c8 = (double)piVar7[uVar14];
    if (dStack_c8 < dVar15) break;
  }
  if (0.0 < dVar15) {
    *(double *)paStack_b0 = dVar15;
    *pfStack_a8 = fStack_c0;
  }
  return;
}

Assistant:

inline void aggreports::OutputRows(const std::vector<int> &fileIDs,
				   const char * buffer, int strLen) {

  for (std::vector<int>::const_iterator it = fileIDs.begin();
       it != fileIDs.end(); ++it) {

    const char * bufPtr = buffer;
    int num;
    int counter = 0;
    do {

      num = fprintf(fout_[*it], "%s", bufPtr);
      if (num < 0) {   // Write error
	fprintf(stderr, "FATAL: Error writing %s: %s\n",
		buffer, strerror(errno));
	exit(EXIT_FAILURE);
      } else if (num < strLen) {   // Incomplete write
	bufPtr += num;
	strLen -= num;
      } else break;   // Success

      fprintf(stderr, "INFO: Attempt %d to write %s\n", ++counter, buffer);

      if (counter == 10) {
	fprintf(stderr, "FATAL: Maximum attempts to write %s exceeded\n",
		buffer);
	exit(EXIT_FAILURE);
      }

    } while (true);

  }

}